

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O0

void squall::detail::construct_object<std::function<void(Foo*,int)>>
               (HSQUIRRELVM vm,function<void_(Foo_*,_int)> *v)

{
  undefined8 *puVar1;
  function<void_(Foo_*,_int)> *this;
  _func_SQInteger_SQUserPointer_SQInteger *idx;
  SQRELEASEHOOK in_stack_ffffffffffffffc0;
  SQRELEASEHOOK hook;
  SQUserPointer p;
  function<void_(Foo_*,_int)> *v_local;
  HSQUIRRELVM vm_local;
  
  puVar1 = (undefined8 *)sq_newuserdata(vm,(SQUnsignedInteger)v);
  this = (function<void_(Foo_*,_int)> *)operator_new(0x20);
  std::function<void_(Foo_*,_int)>::function(this,v);
  *puVar1 = this;
  idx = construct_object(SQVM*,std::function_const&)::{lambda(void*,long_long)#1}::
        operator_cast_to_function_pointer((_lambda_void__long_long__1_ *)&stack0xffffffffffffffc7);
  sq_setreleasehook((HSQUIRRELVM)hook,(SQInteger)idx,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void construct_object(HSQUIRRELVM vm, const T& v) {
    SQUserPointer p = sq_newuserdata(vm, sizeof(T*));
    *((T**)p) = new T(v);
    SQRELEASEHOOK hook = [](SQUserPointer p, SQInteger)->SQInteger {
        delete *((T**)p);
        return 0;
    };
    sq_setreleasehook(vm, -1, hook);
}